

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall DnsStats::UpdateDuration(DnsStats *this,my_bpftimeval ts)

{
  long lVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  
  uVar3 = (uint32_t)ts.tv_sec;
  uVar2 = (uint32_t)ts.tv_usec;
  if (this->t_start_sec == 0 && this->t_start_usec == 0) {
    this->t_start_sec = uVar3;
    this->t_start_usec = uVar2;
    return;
  }
  lVar1 = (long)(int)(uVar2 - this->t_start_usec) + (long)(int)(uVar3 - this->t_start_sec) * 1000000
  ;
  if (-1 < lVar1) {
    if (this->duration_usec < lVar1) {
      this->duration_usec = lVar1;
    }
    return;
  }
  this->t_start_sec = uVar3;
  this->t_start_usec = uVar2;
  this->duration_usec = this->duration_usec - lVar1;
  return;
}

Assistant:

void DnsStats::UpdateDuration(my_bpftimeval ts)
{
    if (t_start_sec == 0 && t_start_usec == 0) {
        t_start_sec = ts.tv_sec;
        t_start_usec = ts.tv_usec;
    }
    else {
        int64_t delta_t = DeltaUsec(ts.tv_sec, ts.tv_usec, t_start_sec, t_start_usec);

        if (delta_t < 0) {
            t_start_sec = ts.tv_sec;
            t_start_usec = ts.tv_usec;
            duration_usec -= delta_t;
        }
        else if (delta_t > duration_usec) {
            duration_usec = delta_t;
        }
    }
}